

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O2

void synchronize(void)

{
  int iVar1;
  long lVar2;
  int64_t eval_b;
  int64_t eval_a;
  
  synchronize_nowait();
  iVar1 = step;
  lVar2 = (long)step;
  while (iVar1 == step) {
    uv_cond_wait(&condvar,&mutex);
  }
  if ((long)step == lVar2 + 1) {
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-mutexes.c"
          ,0x68,"step","==","current + 1",(long)step,"==",lVar2 + 1);
  abort();
}

Assistant:

static void synchronize(void) {
  int current;

  synchronize_nowait();
  /* Wait for the other thread.  Guard against spurious wakeups. */
  for (current = step; current == step; uv_cond_wait(&condvar, &mutex));
  ASSERT_EQ(step, current + 1);
}